

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O1

void FOOLElimination::buildApplication
               (uint symbol,Context context,TermStack *vars,TermList *functionApplication,
               Formula **predicateApplication)

{
  Term *pTVar1;
  Formula *pFVar2;
  Literal *pLVar3;
  undefined7 in_register_00000031;
  void **head;
  
  if ((int)CONCAT71(in_register_00000031,context) == 0) {
    pFVar2 = (Formula *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pLVar3 = Kernel::Literal::create
                       (symbol,(uint)((ulong)((long)vars->_cursor - (long)vars->_stack) >> 3),true,
                        vars->_stack);
    pFVar2->_connective = LITERAL;
    (pFVar2->_label)._M_dataplus._M_p = (pointer)&(pFVar2->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar2->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(pFVar2 + 1) = pLVar3;
    *predicateApplication = pFVar2;
  }
  else {
    pTVar1 = Kernel::Term::create
                       (symbol,(uint)((ulong)((long)vars->_cursor - (long)vars->_stack) >> 3),
                        vars->_stack);
    functionApplication->_content = (uint64_t)pTVar1;
  }
  return;
}

Assistant:

void FOOLElimination::buildApplication(unsigned symbol, Context context, TermStack& vars,
                                       TermList& functionApplication, Formula*& predicateApplication) {
  if (context == FORMULA_CONTEXT) {
    predicateApplication = new AtomicFormula(Literal::create(symbol, vars.size(), true, vars.begin()));
  } else {
    functionApplication = TermList(Term::create(symbol, vars.size(), vars.begin()));
  }
}